

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  size_type sVar3;
  cmGeneratorTarget *pcVar4;
  pointer pbVar5;
  cmComputeLinkInformation *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined7 extraout_var;
  cmValue cVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  string *psVar12;
  LinkClosure *pLVar13;
  byte bVar14;
  string *li;
  pointer pbVar15;
  byte bVar16;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view prefix_02;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string d;
  string install_rpath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string targetOutputDir;
  char local_119;
  cmComputeLinkInformation *local_118;
  undefined4 local_10c;
  string local_108;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_e8;
  string local_e0;
  string *local_c0;
  undefined1 local_b8 [32];
  _Base_ptr local_98;
  size_t local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  pcVar2 = this->Makefile;
  local_118 = this;
  local_e8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)runtimeDirs;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"CMAKE_SKIP_RPATH",(allocator<char> *)&local_70);
  bVar7 = cmMakefile::IsOn(pcVar2,(string *)local_b8);
  sVar3 = (local_118->RuntimeFlag)._M_string_length;
  std::__cxx11::string::~string((string *)local_b8);
  bVar8 = true;
  if (!for_install) {
    pcVar4 = local_118->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)&local_70);
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
  }
  pcVar6 = local_118;
  if (bVar7 || sVar3 == 0) {
    bVar16 = 0;
LAB_00373338:
    bVar14 = 0;
    local_10c = 0;
  }
  else {
    psVar12 = &local_118->Config;
    bVar7 = cmGeneratorTarget::HaveInstallTreeRPATH(local_118->Target,psVar12);
    bVar9 = cmGeneratorTarget::HaveBuildTreeRPATH(pcVar6->Target,psVar12);
    bVar16 = bVar9 & (bVar8 ^ 1U);
    if ((bVar8 ^ 1U) != 0) goto LAB_00373338;
    pcVar2 = pcVar6->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,"CMAKE_SKIP_INSTALL_RPATH",(allocator<char> *)&local_e0);
    bVar9 = cmMakefile::IsOn(pcVar2,(string *)local_b8);
    if (bVar9) {
      local_10c = 0;
    }
    else {
      pcVar4 = local_118->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"INSTALL_RPATH_USE_LINK_PATH",(allocator<char> *)&local_108);
      bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,&local_70);
      local_10c = (undefined4)CONCAT71(extraout_var,bVar9);
      std::__cxx11::string::~string((string *)&local_70);
    }
    bVar14 = bVar8 & bVar7;
    std::__cxx11::string::~string((string *)local_b8);
  }
  pcVar2 = local_118->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN",
             (allocator<char> *)&local_70);
  local_80 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  pcVar6 = local_118;
  local_88 = &local_118->Config;
  cmGeneratorTarget::GetDirectory(&local_70,local_118->Target,local_88,RuntimeBinaryArtifact);
  pcVar4 = pcVar6->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"BUILD_RPATH_USE_ORIGIN",(allocator<char> *)&local_e0);
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)local_b8);
  sVar3 = local_80->_M_string_length;
  std::__cxx11::string::~string((string *)local_b8);
  local_b8._24_8_ = local_b8 + 8;
  local_b8._8_4_ = _S_red;
  local_b8._16_8_ = 0;
  local_90 = 0;
  paVar1 = &local_e0.field_2;
  local_98 = (_Base_ptr)local_b8._24_8_;
  if (bVar14 != 0) {
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    cmGeneratorTarget::GetInstallRPATH(local_118->Target,local_88,&local_e0);
    cmCLI_ExpandListUnique
              (&local_e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_e8,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b8);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if (bVar16 == 0) {
    if ((char)local_10c == '\0') goto LAB_00373997;
  }
  else {
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    bVar8 = cmGeneratorTarget::GetBuildRPATH(local_118->Target,local_88,&local_e0);
    if (bVar8) {
      cmCLI_ExpandListUnique
                (&local_e0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b8);
    }
    std::__cxx11::string::~string((string *)&local_e0);
  }
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  pcVar2 = local_118->Makefile;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"CMAKE_SYSROOT_LINK",(allocator<char> *)&local_50);
  cVar10 = cmMakefile::GetDefinition(pcVar2,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  if (cVar10.Value == (string *)0x0) {
    pcVar2 = local_118->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"CMAKE_SYSROOT",(allocator<char> *)&local_50);
    cmMakefile::GetSafeDefinition(pcVar2,&local_108);
    std::__cxx11::string::_M_assign((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_e0);
  }
  pcVar2 = local_118->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"CMAKE_STAGING_PREFIX",(allocator<char> *)&local_50);
  cVar10 = cmMakefile::GetDefinition(pcVar2,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  pcVar2 = local_118->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&local_50);
  local_78 = cmMakefile::GetSafeDefinition(pcVar2,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_e0);
  pcVar6 = local_118;
  pvVar11 = GetRuntimeSearchPath_abi_cxx11_(local_118);
  local_c0 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar6->CMakeInstance);
  pbVar5 = (pvVar11->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar15 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar5;
      pbVar15 = pbVar15 + 1) {
    if (bVar16 == 0) {
      if ((char)local_10c != '\0') {
        psVar12 = cmake::GetHomeDirectory_abi_cxx11_(local_118->CMakeInstance);
        bVar8 = cmsys::SystemTools::ComparePath(pbVar15,psVar12);
        if (!bVar8) {
          bVar8 = cmsys::SystemTools::ComparePath(pbVar15,local_c0);
          if (bVar8) goto LAB_003738e9;
          bVar8 = cmsys::SystemTools::IsSubDirectory(pbVar15,psVar12);
          if (bVar8) goto LAB_003738e9;
          bVar8 = cmsys::SystemTools::IsSubDirectory(pbVar15,local_c0);
          if (bVar8) goto LAB_003738e9;
          std::__cxx11::string::string((string *)&local_108,(string *)pbVar15);
          if (local_e0._M_string_length == 0) {
LAB_003738f2:
            if ((cVar10.Value != (string *)0x0) && ((cVar10.Value)->_M_string_length != 0)) {
              prefix_02._M_str = ((cVar10.Value)->_M_dataplus)._M_p;
              prefix_02._M_len = (cVar10.Value)->_M_string_length;
              str_02._M_str = local_108._M_dataplus._M_p;
              str_02._M_len = local_108._M_string_length;
              bVar8 = cmHasPrefix(str_02,prefix_02);
              if (bVar8) {
                std::__cxx11::string::erase((ulong)&local_108,0);
                local_119 = '/';
                cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                          (&local_50,local_78,&local_119,&local_108);
                std::__cxx11::string::operator=((string *)&local_108,(string *)&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                cmsys::SystemTools::ConvertToUnixSlashes(&local_108);
              }
            }
          }
          else {
            prefix_00._M_str = local_e0._M_dataplus._M_p;
            prefix_00._M_len = local_e0._M_string_length;
            str_00._M_str = local_108._M_dataplus._M_p;
            str_00._M_len = local_108._M_string_length;
            bVar8 = cmHasPrefix(str_00,prefix_00);
            if (!bVar8) goto LAB_003738f2;
            std::__cxx11::string::erase((ulong)&local_108,0);
          }
          pVar17 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)local_b8,&local_108);
          if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_e8,&local_108);
          }
          goto LAB_003738e1;
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_108,(string *)pbVar15);
      if (local_e0._M_string_length == 0) {
LAB_003737a8:
        if ((cVar10.Value != (string *)0x0) && ((cVar10.Value)->_M_string_length != 0)) {
          prefix_01._M_str = ((cVar10.Value)->_M_dataplus)._M_p;
          prefix_01._M_len = (cVar10.Value)->_M_string_length;
          str_01._M_str = local_108._M_dataplus._M_p;
          str_01._M_len = local_108._M_string_length;
          bVar8 = cmHasPrefix(str_01,prefix_01);
          if (bVar8) {
            std::__cxx11::string::erase((ulong)&local_108,0);
            local_119 = '/';
            cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                      (&local_50,local_78,&local_119,&local_108);
            std::__cxx11::string::operator=((string *)&local_108,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            cmsys::SystemTools::ConvertToUnixSlashes(&local_108);
            goto LAB_003738c2;
          }
        }
        if ((bVar7 && local_70._M_string_length != 0) && sVar3 != 0) {
          bVar8 = cmsys::SystemTools::ComparePath(&local_108,local_c0);
          if (!bVar8) {
            bVar8 = cmsys::SystemTools::IsSubDirectory(&local_108,local_c0);
            if (!bVar8) goto LAB_003738c2;
          }
          cmSystemTools::RelativePath(&local_50,&local_70,&local_108);
          std::__cxx11::string::operator=((string *)&local_108,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (local_108._M_string_length == 0) {
            std::__cxx11::string::_M_assign((string *)&local_108);
          }
          else {
            cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&>
                      (&local_50,local_80,(char (*) [2])0x746d41,&local_108);
            std::__cxx11::string::operator=((string *)&local_108,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      else {
        prefix._M_str = local_e0._M_dataplus._M_p;
        prefix._M_len = local_e0._M_string_length;
        str._M_str = local_108._M_dataplus._M_p;
        str._M_len = local_108._M_string_length;
        bVar8 = cmHasPrefix(str,prefix);
        if (!bVar8) goto LAB_003737a8;
        std::__cxx11::string::erase((ulong)&local_108,0);
      }
LAB_003738c2:
      pVar17 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)local_b8,&local_108);
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_e8,&local_108);
      }
LAB_003738e1:
      std::__cxx11::string::~string((string *)&local_108);
    }
LAB_003738e9:
  }
  std::__cxx11::string::~string((string *)&local_e0);
LAB_00373997:
  pLVar13 = cmGeneratorTarget::GetLinkClosure(local_118->Target,local_88);
  pbVar5 = (pLVar13->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar15 = (pLVar13->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar5; pbVar15 = pbVar15 + 1
      ) {
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[47]>
              (&local_e0,(char (*) [7])0x695e73,pbVar15,
               (char (*) [47])"_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
    bVar7 = cmMakefile::IsOn(local_118->Makefile,&local_e0);
    if (bVar7) {
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[27]>
                (&local_108,(char (*) [7])0x695e73,pbVar15,(char (*) [27])0x6cc4f3);
      cVar10 = cmMakefile::GetDefinition(local_118->Makefile,&local_108);
      if (cVar10.Value != (string *)0x0) {
        cmCLI_ExpandListUnique
                  (cVar10.Value,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b8);
      }
      std::__cxx11::string::~string((string *)&local_108);
    }
    std::__cxx11::string::~string((string *)&local_e0);
  }
  cmCLI_ExpandListUnique
            (&local_118->RuntimeAlways,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e8,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH(this->Config) &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    std::string install_rpath;
    this->Target->GetInstallRPATH(this->Config, install_rpath);
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    std::string build_rpath;
    if (this->Target->GetBuildRPATH(this->Config, build_rpath)) {
      // This will not resolve entries to use $ORIGIN, the user is expected
      // to do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (cmValue sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = *sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    cmValue stagePath = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
          d.erase(0, rootPath.size());
        } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
          d.erase(0, (*stagePath).size());
          d = cmStrCat(installPrefix, '/', d);
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = cmStrCat(originToken, "/", d);
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
            d.erase(0, rootPath.size());
          } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
            d.erase(0, (*stagePath).size());
            d = cmStrCat(installPrefix, '/', d);
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar = cmStrCat(
        "CMAKE_", li, "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar =
          cmStrCat("CMAKE_", li, "_IMPLICIT_LINK_DIRECTORIES");
        if (cmValue dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(*dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways, runtimeDirs, emitted);
}